

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::run_creation_work_item_raytracing
          (ThreadedReplayer *this,PipelineWorkItem *work_item)

{
  uint i;
  uint uVar1;
  VkPipelineCache cache;
  
  cache = this->disk_pipeline_cache;
  if (cache == (VkPipelineCache)0x0) {
    cache = this->memory_context_pipeline_cache[work_item->memory_context_index];
  }
  for (uVar1 = 0; uVar1 < this->loop_count; uVar1 = uVar1 + 1) {
    run_creation_work_item_raytracing_iteration(this,work_item,cache,uVar1 == 0);
  }
  return;
}

Assistant:

void run_creation_work_item_raytracing(const PipelineWorkItem &work_item)
	{
		auto cache = get_current_pipeline_cache(work_item);
		for (unsigned i = 0; i < loop_count; i++)
			run_creation_work_item_raytracing_iteration(work_item, cache, i == 0);
	}